

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDetect.c
# Opt level: O1

int Mio_LibGateSimulateOne(Mio_Gate_t *pGate,int *iBits)

{
  uint uVar1;
  word *pwVar2;
  ulong uVar3;
  uint uVar4;
  uint uVar5;
  
  uVar1 = Mio_GateReadPinNum(pGate);
  if ((int)uVar1 < 1) {
    uVar5 = 0;
  }
  else {
    uVar3 = 0;
    uVar5 = 0;
    do {
      uVar4 = 1 << ((byte)uVar3 & 0x1f);
      if (iBits[uVar3] == 0) {
        uVar4 = 0;
      }
      uVar5 = uVar5 | uVar4;
      uVar3 = uVar3 + 1;
    } while (uVar1 != uVar3);
  }
  pwVar2 = Mio_GateReadTruthP(pGate);
  return (int)((*(uint *)((long)pwVar2 + (long)((int)uVar5 >> 5) * 4) >> (uVar5 & 0x1f) & 1) != 0);
}

Assistant:

int Mio_LibGateSimulateOne( Mio_Gate_t * pGate, int iBits[6] )
{
    int nVars = Mio_GateReadPinNum(pGate);
    int i, iMint = 0;
    for ( i = 0; i < nVars; i++ )
        if ( iBits[i] )
            iMint |= (1 << i);
    return Abc_InfoHasBit( (unsigned *)Mio_GateReadTruthP(pGate), iMint );
}